

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Schema.cc
# Opt level: O2

void __thiscall avro::UnionSchema::UnionSchema(UnionSchema *this)

{
  Node *node;
  
  node = (Node *)operator_new(0x30);
  node->type_ = AVRO_UNION;
  node->locked_ = false;
  node[2]._vptr_Node = (_func_int **)0x0;
  node[1]._vptr_Node = (_func_int **)0x0;
  node[1].type_ = AVRO_STRING;
  node[1].locked_ = false;
  *(undefined3 *)&node[1].field_0xd = 0;
  node->_vptr_Node = (_func_int **)&PTR__NodeImpl_001eb748;
  Schema::Schema(&this->super_Schema,node);
  (this->super_Schema)._vptr_Schema = (_func_int **)&PTR__Schema_001eba10;
  return;
}

Assistant:

UnionSchema::UnionSchema() :
    Schema(new NodeUnion)
{ }